

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Map_Man_t *
Abc_NtkToMap(Abc_Ntk_t *pNtk,double DelayTarget,int fRecovery,float *pSwitching,int fVerbose)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  Map_Man_t *p;
  char **ppNames;
  Scl_Con_t *pSVar6;
  Abc_Time_t *pAVar7;
  Map_Time_t *pMVar8;
  Map_Node_t *pMVar9;
  Abc_Obj_t *pAVar10;
  Map_Node_t **ppMVar11;
  Vec_Ptr_t *p_00;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  char *__assertion;
  ulong uVar15;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x10d,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
  }
  p = Map_ManCreate((pNtk->vPis->nSize + pNtk->nObjCounts[8]) - pNtk->nBarBufs,
                    (pNtk->nObjCounts[8] - pNtk->nBarBufs) + pNtk->vPos->nSize,fVerbose);
  if (p == (Map_Man_t *)0x0) {
    return (Map_Man_t *)0x0;
  }
  Map_ManSetAreaRecovery(p,fRecovery);
  ppNames = Abc_NtkCollectCioNames(pNtk,1);
  Map_ManSetOutputNames(p,ppNames);
  Map_ManSetDelayTarget(p,(float)DelayTarget);
  iVar5 = Scl_ConIsRunning();
  if (iVar5 == 0) {
LAB_0029a25b:
    pAVar7 = Abc_NtkGetCiArrivalTimes(pNtk);
    pMVar8 = Abc_NtkMapCopyCiArrival(pNtk,pAVar7);
  }
  else {
    pSVar6 = Scl_ConReadMan();
    iVar5 = Vec_IntCountZero(&pSVar6->vInArrs);
    if (iVar5 == (pSVar6->vInArrs).nSize) goto LAB_0029a25b;
    pMVar8 = Abc_NtkMapCopyCiArrivalCon(pNtk);
  }
  Map_ManSetInputArrivals(p,pMVar8);
  iVar5 = Scl_ConIsRunning();
  if (iVar5 != 0) {
    pSVar6 = Scl_ConReadMan();
    iVar5 = Vec_IntCountZero(&pSVar6->vOutReqs);
    if (iVar5 != (pSVar6->vOutReqs).nSize) {
      pMVar8 = Abc_NtkMapCopyCoRequiredCon(pNtk);
      goto LAB_0029a2ce;
    }
  }
  pAVar7 = Abc_NtkGetCoRequiredTimes(pNtk);
  pMVar8 = Abc_NtkMapCopyCoRequired(pNtk,pAVar7);
LAB_0029a2ce:
  Map_ManSetOutputRequireds(p,pMVar8);
  Abc_NtkCleanCopy(pNtk);
  pMVar9 = Map_ManReadConst1(p);
  pAVar10 = Abc_AigConst1(pNtk);
  (pAVar10->field_6).pCopy = (Abc_Obj_t *)pMVar9;
  for (uVar15 = 0;
      ((long)uVar15 < (long)pNtk->vCis->nSize &&
      (pAVar10 = Abc_NtkCi(pNtk,(int)uVar15), uVar15 != (uint)(pNtk->vCis->nSize - pNtk->nBarBufs)))
      ; uVar15 = uVar15 + 1) {
    ppMVar11 = Map_ManReadInputs(p);
    pMVar9 = ppMVar11[uVar15];
    (pAVar10->field_6).pCopy = (Abc_Obj_t *)pMVar9;
    if (pSwitching != (float *)0x0) {
      Map_NodeSetSwitching(pMVar9,pSwitching[pAVar10->Id]);
    }
  }
  p_00 = Abc_AigDfsMap(pNtk);
  iVar5 = 0;
  do {
    if (p_00->nSize <= iVar5) {
      iVar5 = Map_ManReadBufNum(p);
      if (iVar5 == pNtk->nBarBufs) {
        Vec_PtrFree(p_00);
        for (uVar15 = 0;
            ((long)uVar15 < (long)pNtk->vCos->nSize &&
            (pAVar10 = Abc_NtkCo(pNtk,(int)uVar15),
            uVar15 != (uint)(pNtk->vCos->nSize - pNtk->nBarBufs))); uVar15 = uVar15 + 1) {
          uVar1 = *(uint *)&pAVar10->field_0x14;
          uVar4 = *(ulong *)((long)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray] + 0x40);
          ppMVar11 = Map_ManReadOutputs(p);
          ppMVar11[uVar15] = (Map_Node_t *)(uVar1 >> 10 & 1 ^ uVar4);
        }
        return p;
      }
      __assert_fail("Map_ManReadBufNum(pMan) == pNtk->nBarBufs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                    ,0x14b,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
    }
    plVar12 = (long *)Vec_PtrEntry(p_00,iVar5);
    uVar1 = *(uint *)((long)plVar12 + 0x14);
    if ((uVar1 & 0xf) == 7) {
      lVar3 = *(long *)(*(long *)(*plVar12 + 0x20) + 8);
      pMVar9 = Map_NodeAnd(p,(Map_Node_t *)
                             ((ulong)(uVar1 >> 10 & 1) ^
                             *(ulong *)(*(long *)(lVar3 + (long)*(int *)plVar12[4] * 8) + 0x40)),
                           (Map_Node_t *)
                           ((ulong)(uVar1 >> 0xb & 1) ^
                           *(ulong *)(*(long *)(lVar3 + (long)((int *)plVar12[4])[1] * 8) + 0x40)));
      if (plVar12[8] != 0) {
        __assert_fail("pNode->pCopy == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                      ,0x13e,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
      }
      plVar12[8] = (long)pMVar9;
      if (pSwitching != (float *)0x0) {
        Map_NodeSetSwitching(pMVar9,pSwitching[(int)plVar12[2]]);
      }
      if (((ulong)plVar12 & 1) != 0) {
        __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0029a591:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                      ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
      }
      if (*(int *)*plVar12 != 3) {
        __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_0029a591;
      }
      if (((long *)plVar12[7] != (long *)0x0) &&
         (plVar2 = (long *)plVar12[7], plVar14 = plVar12, 0 < *(int *)((long)plVar12 + 0x2c))) {
        while (plVar13 = plVar2, plVar13 != (long *)0x0) {
          Map_NodeSetNextE((Map_Node_t *)plVar14[8],(Map_Node_t *)plVar13[8]);
          Map_NodeSetRepr((Map_Node_t *)plVar13[8],(Map_Node_t *)plVar12[8]);
          plVar14 = plVar13;
          plVar2 = (long *)plVar13[7];
        }
      }
    }
    else {
      if ((uVar1 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                      ,0x139,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
      }
      plVar2 = *(long **)(*(long *)(*(long *)(*plVar12 + 0x20) + 8) + (long)*(int *)plVar12[4] * 8);
      pMVar9 = Map_NodeBuf(p,(Map_Node_t *)
                             ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                             *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                 (long)*(int *)plVar2[4] * 8) + 0x40)));
      *(Map_Node_t **)
       (*(long *)(*(long *)(*(long *)(*plVar12 + 0x20) + 8) + (long)*(int *)plVar12[6] * 8) + 0x40)
           = pMVar9;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Map_Man_t * Abc_NtkToMap( Abc_Ntk_t * pNtk, double DelayTarget, int fRecovery, float * pSwitching, int fVerbose )
{
    Map_Man_t * pMan;
    Map_Node_t * pNodeMap;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pMan = Map_ManCreate( Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, fVerbose );
    if ( pMan == NULL )
        return NULL;
    Map_ManSetAreaRecovery( pMan, fRecovery );
    Map_ManSetOutputNames( pMan, Abc_NtkCollectCioNames(pNtk, 1) );
    Map_ManSetDelayTarget( pMan, (float)DelayTarget );

    // set arrival and requireds
    if ( Scl_ConIsRunning() && Scl_ConHasInArrs() )
        Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrivalCon(pNtk) );
    else
        Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrival(pNtk, Abc_NtkGetCiArrivalTimes(pNtk)) );
    if ( Scl_ConIsRunning() && Scl_ConHasOutReqs() )
        Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequiredCon(pNtk) );
    else
        Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequired(pNtk, Abc_NtkGetCoRequiredTimes(pNtk)) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Map_ManReadConst1(pMan);
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        pNodeMap = Map_ManReadInputs(pMan)[i];
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
    }

    // load the AIG into the mapper
    vNodes = Abc_AigDfsMap( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
        {
            pFanin = Abc_ObjFanin0(pNode);
            pNodeMap = Map_NodeBuf( pMan, Map_NotCond( Abc_ObjFanin0(pFanin)->pCopy, (int)Abc_ObjFaninC0(pFanin) ) );
            Abc_ObjFanout0(pNode)->pCopy = (Abc_Obj_t *)pNodeMap;
            continue;
        }
        assert( Abc_ObjIsNode(pNode) );
        // add the node to the mapper
        pNodeMap = Map_NodeAnd( pMan, 
            Map_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) ),
            Map_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) ) );
        assert( pNode->pCopy == NULL );
        // remember the node
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
            for ( pPrev = pNode, pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
            {
                Map_NodeSetNextE( (Map_Node_t *)pPrev->pCopy, (Map_Node_t *)pFanin->pCopy );
                Map_NodeSetRepr( (Map_Node_t *)pFanin->pCopy, (Map_Node_t *)pNode->pCopy );
            }
    }
    assert( Map_ManReadBufNum(pMan) == pNtk->nBarBufs );
    Vec_PtrFree( vNodes );

    // set the primary outputs in the required phase
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Map_ManReadOutputs(pMan)[i] = Map_NotCond( (Map_Node_t *)Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
    }
    return pMan;
}